

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

bool lsim::deserialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  bool bVar1;
  undefined1 local_140 [8];
  Deserializer deserializer;
  char *filename_local;
  ModelCircuitLibrary *lib_local;
  LSimContext *context_local;
  
  deserializer.m_component_id_map._M_h._M_single_bucket = (__node_base_ptr)filename;
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23e,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23f,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x240,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  anon_unknown.dwarf_14aaaa::Deserializer::Deserializer((Deserializer *)local_140,context);
  bVar1 = anon_unknown.dwarf_14aaaa::Deserializer::load_from_file
                    ((Deserializer *)local_140,
                     (char *)deserializer.m_component_id_map._M_h._M_single_bucket);
  if (bVar1) {
    anon_unknown.dwarf_14aaaa::Deserializer::parse_library((Deserializer *)local_140,lib);
  }
  anon_unknown.dwarf_14aaaa::Deserializer::~Deserializer((Deserializer *)local_140);
  return bVar1;
}

Assistant:

bool deserialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Deserializer deserializer(context);
    
    if (!deserializer.load_from_file(filename)) {
        return false;
    }

    deserializer.parse_library(lib);

    return true;
}